

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O2

void __thiscall
tchecker::clockbounds::local_m_map_t::resize
          (local_m_map_t *this,loc_id_t loc_nb,clock_id_t clock_nb)

{
  map_t *pmVar1;
  loc_id_t id;
  ulong uVar2;
  value_type local_20;
  
  clear(this);
  this->_loc_nb = loc_nb;
  this->_clock_nb = clock_nb;
  local_20 = (value_type)0x0;
  std::
  vector<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
  ::resize(&this->_M,(ulong)loc_nb,&local_20);
  for (uVar2 = 0; uVar2 < this->_loc_nb; uVar2 = uVar2 + 1) {
    pmVar1 = allocate_map((ulong)this->_clock_nb);
    (this->_M).
    super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar2] = pmVar1;
    clockbounds::clear((this->_M).
                       super__Vector_base<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*,_std::allocator<tchecker::make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar2]);
  }
  return;
}

Assistant:

void local_m_map_t::resize(tchecker::loc_id_t loc_nb, tchecker::clock_id_t clock_nb)
{
  clear();

  _loc_nb = loc_nb;
  _clock_nb = clock_nb;
  _M.resize(_loc_nb, nullptr);
  for (tchecker::loc_id_t id = 0; id < _loc_nb; ++id) {
    _M[id] = tchecker::clockbounds::allocate_map(_clock_nb);
    tchecker::clockbounds::clear(*_M[id]);
  }
}